

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

void __thiscall tcu::Texture3D::allocLevel(Texture3D *this,int levelNdx)

{
  byte bVar1;
  int height;
  int width;
  int iVar2;
  int depth;
  
  bVar1 = (byte)levelNdx;
  width = this->m_width >> (bVar1 & 0x1f);
  iVar2 = 1;
  if (width < 2) {
    width = iVar2;
  }
  height = this->m_height >> (bVar1 & 0x1f);
  if (height < 2) {
    height = iVar2;
  }
  depth = this->m_depth >> (bVar1 & 0x1f);
  if (depth < 2) {
    depth = iVar2;
  }
  TextureLevelPyramid::allocLevel(&this->super_TextureLevelPyramid,levelNdx,width,height,depth);
  return;
}

Assistant:

void Texture3D::allocLevel (int levelNdx)
{
	DE_ASSERT(de::inBounds(levelNdx, 0, getNumLevels()));

	const int width		= getMipPyramidLevelSize(m_width,	levelNdx);
	const int height	= getMipPyramidLevelSize(m_height,	levelNdx);
	const int depth		= getMipPyramidLevelSize(m_depth,	levelNdx);

	TextureLevelPyramid::allocLevel(levelNdx, width, height, depth);
}